

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OsCompat.cpp
# Opt level: O3

char * OsCompat::filename(char *str)

{
  char *pcVar1;
  char *__src;
  
  pcVar1 = strrchr(str,0x2e);
  if ((pcVar1 != (char *)0x0) && ((pcVar1 != str || (*pcVar1 != '.')))) {
    pcVar1 = (char *)malloc(0x100);
    __src = strtok(str,".");
    pcVar1 = strncpy(pcVar1,__src,0x100);
    return pcVar1;
  }
  return str;
}

Assistant:

char * OsCompat::filename(const char *str) {
    char *result;
    char *last;
    char *tmpStr = const_cast<char *>(str);
    if ((last = strrchr(tmpStr, '.')) != nullptr ) {
        if ((*last == '.') && (last == tmpStr)) {
            return tmpStr;
        } else {
            result = (char*) malloc(_MAX_FNAME);
            char *fname = strtok(tmpStr,".");
            strncpy(result,fname,_MAX_FNAME);
            return result;
        }
    } else {
        return tmpStr;
    }
}